

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * __thiscall
helics::RandomDelayFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDelayFilterOperation *this,string_view property)

{
  atomic<helics::RandomDistributions> aVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  __atomic_float<double> __val;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  allocator<char> local_29;
  
  __y._M_str = "dist";
  __y._M_len = 4;
  bVar2 = std::operator==(property,__y);
  if ((!bVar2) &&
     (__y_00._M_str = "distribution", __y_00._M_len = 0xc, bVar2 = std::operator==(property,__y_00),
     !bVar2)) {
    __y_01._M_str = "param1";
    __y_01._M_len = 6;
    bVar2 = std::operator==(property,__y_01);
    if ((((bVar2) ||
         (__y_02._M_str = "mean", __y_02._M_len = 4, bVar2 = std::operator==(property,__y_02), bVar2
         )) || (__y_03._M_str = "min", __y_03._M_len = 3, bVar2 = std::operator==(property,__y_03),
               bVar2)) ||
       (__y_04._M_str = "alpha", __y_04._M_len = 5, bVar2 = std::operator==(property,__y_04), bVar2)
       ) {
      __val._M_fp = (((this->rdelayGen)._M_t.
                      super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                      .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                    param1).super___atomic_float<double>._M_fp;
    }
    else {
      __y_05._M_str = "param2";
      __y_05._M_len = 6;
      bVar2 = std::operator==(property,__y_05);
      if (((!bVar2) &&
          (__y_06._M_str = "stddev", __y_06._M_len = 6, bVar2 = std::operator==(property,__y_06),
          !bVar2)) &&
         ((__y_07._M_str = "max", __y_07._M_len = 3, bVar2 = std::operator==(property,__y_07),
          !bVar2 && (__y_08._M_str = "beta", __y_08._M_len = 4,
                    bVar2 = std::operator==(property,__y_08), !bVar2)))) goto LAB_001ce5bb;
      __val._M_fp = (((this->rdelayGen)._M_t.
                      super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                      .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                    param2).super___atomic_float<double>._M_fp;
    }
    CLI::std::__cxx11::to_string((string *)__return_storage_ptr__,__val._M_fp);
    return __return_storage_ptr__;
  }
  aVar1._M_i = (((this->rdelayGen)._M_t.
                 super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                 .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist).
               _M_i;
  for (p_Var3 = (_Rb_tree_node_base *)distMap._24_8_; p_Var3 != (_Rb_tree_node_base *)(distMap + 8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (*(RandomDistributions *)&p_Var3[1]._M_left == aVar1._M_i) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)(p_Var3 + 1),&local_29);
      return __return_storage_ptr__;
    }
  }
LAB_001ce5bb:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDelayFilterOperation::getString(std::string_view property)
{
    if ((property == "dist") || (property == "distribution")) {
        auto currentDist = rdelayGen->dist.load();
        for (const auto& distPair : distMap) {
            if (distPair.second == currentDist) {
                return std::string(distPair.first);
            }
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        return std::to_string(rdelayGen->param1.load());
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        return std::to_string(rdelayGen->param2.load());
    }
    return FilterOperations::getString(property);
}